

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_bitwise.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateBaseType(ValidationState_t *_,Instruction *inst,uint32_t base_type)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  DiagnosticStream *pDVar4;
  long lVar5;
  spv_result_t sVar6;
  char *pcVar7;
  char *local_228;
  string local_220;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  bVar2 = ValidationState_t::IsIntScalarType(_,base_type);
  if ((bVar2) || (bVar2 = ValidationState_t::IsIntVectorType(_,base_type), bVar2)) {
    bVar2 = spvIsVulkanEnv(_->context_->target_env);
    if ((!bVar2) || (uVar3 = ValidationState_t::GetBitWidth(_,base_type), uVar3 == 0x20)) {
      if (uVar1 == OpBitCount) {
        return SPV_SUCCESS;
      }
      if ((inst->inst_).type_id == base_type) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"Expected Base Type to be equal to Result Type: ",0x2f);
      local_220._M_dataplus._M_p = spvOpcodeString((uint)uVar1);
      pDVar4 = DiagnosticStream::operator<<(&local_200,(char **)&local_220);
      sVar6 = pDVar4->error_;
      goto LAB_002a0d25;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_220,_,0x12ad,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    pcVar7 = "Expected 32-bit int type for Base operand: ";
    lVar5 = 0x2b;
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_220,_,0x12ad,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    pcVar7 = "Expected int scalar or vector type for Base operand: ";
    lVar5 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar7,lVar5);
  local_228 = spvOpcodeString((uint)uVar1);
  pDVar4 = DiagnosticStream::operator<<(&local_200,&local_228);
  sVar6 = pDVar4->error_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
LAB_002a0d25:
  DiagnosticStream::~DiagnosticStream(&local_200);
  return sVar6;
}

Assistant:

spv_result_t ValidateBaseType(ValidationState_t& _, const Instruction* inst,
                              const uint32_t base_type) {
  const spv::Op opcode = inst->opcode();

  if (!_.IsIntScalarType(base_type) && !_.IsIntVectorType(base_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << _.VkErrorID(4781)
           << "Expected int scalar or vector type for Base operand: "
           << spvOpcodeString(opcode);
  }

  // Vulkan has a restriction to 32 bit for base
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (_.GetBitWidth(base_type) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4781)
             << "Expected 32-bit int type for Base operand: "
             << spvOpcodeString(opcode);
    }
  }

  // OpBitCount just needs same number of components
  if (base_type != inst->type_id() && opcode != spv::Op::OpBitCount) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Base Type to be equal to Result Type: "
           << spvOpcodeString(opcode);
  }

  return SPV_SUCCESS;
}